

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_channel_converter_process_pcm_frames
                    (ma_channel_converter *pConverter,void *pFramesOut,void *pFramesIn,
                    ma_uint64 frameCount)

{
  ma_uint32 mVar1;
  ma_uint32 mVar2;
  size_t __n;
  ma_channel_converter *in_RCX;
  ulong frameCount_00;
  void *in_RDX;
  ma_channel_converter *in_RSI;
  ma_channel_converter *in_RDI;
  ma_uint64 in_stack_000000a0;
  void *in_stack_000000a8;
  void *in_stack_000000b0;
  ma_channel_converter *in_stack_000000b8;
  void *in_stack_ffffffffffffffa0;
  void *in_stack_ffffffffffffffa8;
  ma_result local_2c;
  
  if (in_RDI == (ma_channel_converter *)0x0) {
    local_2c = MA_INVALID_ARGS;
  }
  else if (in_RSI == (ma_channel_converter *)0x0) {
    local_2c = MA_INVALID_ARGS;
  }
  else if (in_RDX == (void *)0x0) {
    mVar1 = in_RDI->channelsOut;
    mVar2 = ma_get_bytes_per_sample(in_RDI->format);
    __n = (long)in_RCX * (ulong)(mVar2 * mVar1);
    if ((in_RSI != (ma_channel_converter *)0x0) && (__n != 0)) {
      memset(in_RSI,0,__n);
    }
    local_2c = MA_SUCCESS;
  }
  else {
    frameCount_00 = (ulong)(in_RDI->conversionPath - ma_channel_conversion_path_passthrough);
    switch(frameCount_00) {
    case 0:
      local_2c = ma_channel_converter_process_pcm_frames__passthrough
                           (in_RSI,in_RDX,in_RCX,(ma_uint64)in_stack_ffffffffffffffa8);
      break;
    case 1:
      local_2c = ma_channel_converter_process_pcm_frames__mono_out
                           (in_RDI,in_RSI,in_RDX,(ma_uint64)in_RCX);
      break;
    case 2:
      local_2c = ma_channel_converter_process_pcm_frames__mono_in
                           (in_RSI,in_RDX,in_RCX,(ma_uint64)in_stack_ffffffffffffffa8);
      break;
    case 3:
      local_2c = ma_channel_converter_process_pcm_frames__shuffle
                           (in_RCX,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,frameCount_00
                           );
      break;
    case 4:
    default:
      local_2c = ma_channel_converter_process_pcm_frames__weights
                           (in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,in_stack_000000a0)
      ;
    }
  }
  return local_2c;
}

Assistant:

MA_API ma_result ma_channel_converter_process_pcm_frames(ma_channel_converter* pConverter, void* pFramesOut, const void* pFramesIn, ma_uint64 frameCount)
{
    if (pConverter == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pFramesOut == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pFramesIn == NULL) {
        ma_zero_memory_64(pFramesOut, frameCount * ma_get_bytes_per_frame(pConverter->format, pConverter->channelsOut));
        return MA_SUCCESS;
    }

    switch (pConverter->conversionPath)
    {
        case ma_channel_conversion_path_passthrough: return ma_channel_converter_process_pcm_frames__passthrough(pConverter, pFramesOut, pFramesIn, frameCount);
        case ma_channel_conversion_path_mono_out:    return ma_channel_converter_process_pcm_frames__mono_out(pConverter, pFramesOut, pFramesIn, frameCount);
        case ma_channel_conversion_path_mono_in:     return ma_channel_converter_process_pcm_frames__mono_in(pConverter, pFramesOut, pFramesIn, frameCount);
        case ma_channel_conversion_path_shuffle:     return ma_channel_converter_process_pcm_frames__shuffle(pConverter, pFramesOut, pFramesIn, frameCount);
        case ma_channel_conversion_path_weights:
        default:
        {
            return ma_channel_converter_process_pcm_frames__weights(pConverter, pFramesOut, pFramesIn, frameCount);
        }
    }
}